

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_core.cc
# Opt level: O0

void get_top_weights<sparse_parameters>
               (vw *all,int top_words_count,int topic,
               vector<feature,_std::allocator<feature>_> *output,sparse_parameters *weights)

{
  float _x;
  uint64_t uVar1;
  undefined4 uVar2;
  ulong uVar3;
  size_t sVar4;
  float *pfVar5;
  char *pcVar6;
  const_reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  *in_RCX;
  int in_EDX;
  int __c;
  int in_ESI;
  long in_RDI;
  iterator iVar10;
  int i_2;
  weight v;
  uint64_t i_1;
  uint64_t i;
  iterator iter;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  top_features;
  anon_class_1_0_00000001 cmp;
  uint64_t length;
  sparse_parameters *in_stack_fffffffffffffeb0;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  *in_stack_fffffffffffffec0;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  *this;
  value_type *in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffed0;
  float in_stack_fffffffffffffed4;
  anon_class_1_0_00000001 *in_stack_fffffffffffffed8;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  *in_stack_fffffffffffffee0;
  int local_d4;
  feature local_d0;
  float local_bc;
  char *local_b8;
  feature local_b0;
  ulong local_a0;
  _Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false> local_98;
  uint32_t local_90;
  sparse_iterator<float> local_88 [2];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  char *local_28;
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
  *local_18;
  int local_10;
  int local_c;
  
  local_28 = (char *)(1L << (*(byte *)(in_RDI + 0x50) & 0x3f));
  local_68 = 0;
  uStack_60 = 0;
  local_58 = 0;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::vector<feature,_std::allocator<feature>_>::vector
            ((vector<feature,_std::allocator<feature>_> *)0x2669c1);
  std::
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
  ::priority_queue(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                   (vector<feature,_std::allocator<feature>_> *)
                   CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
  std::vector<feature,_std::allocator<feature>_>::~vector(&in_stack_fffffffffffffec0->c);
  iVar10 = sparse_parameters::begin(in_stack_fffffffffffffeb0);
  local_98._M_cur =
       (__node_type *)
       iVar10._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
  ;
  local_90 = iVar10._stride;
  local_a0 = 0;
  local_88[0]._iter.super__Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>._M_cur
       = (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)
         (_Node_iterator_base<std::pair<const_unsigned_long,_float_*>,_false>)local_98._M_cur;
  local_88[0]._stride = local_90;
  while( true ) {
    uVar3 = local_a0;
    pcVar6 = local_28;
    sVar4 = min((long)local_c,(size_t)local_28);
    if (sVar4 <= uVar3) break;
    pfVar5 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x266a8d);
    _x = pfVar5[local_10];
    pcVar6 = sparse_iterator<float>::index(local_88,pcVar6,__c);
    feature::feature(&local_b0,_x,(uint64_t)pcVar6);
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
    ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
            *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
           in_stack_fffffffffffffec8);
    local_a0 = local_a0 + 1;
    sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffeb0);
  }
  local_b8 = (char *)(long)local_c;
  while (local_b8 < local_28) {
    pfVar5 = sparse_iterator<float>::operator*((sparse_iterator<float> *)0x266b99);
    in_stack_fffffffffffffed4 = pfVar5[local_10];
    local_bc = in_stack_fffffffffffffed4;
    pvVar7 = std::
             priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
             ::top((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
                    *)0x266bd7);
    if (pvVar7->x <= in_stack_fffffffffffffed4 && in_stack_fffffffffffffed4 != pvVar7->x) {
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
      ::pop(in_stack_fffffffffffffec0);
      feature::feature(&local_d0,local_bc,(uint64_t)local_b8);
      std::
      priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
      ::push((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
              *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),
             in_stack_fffffffffffffec8);
    }
    local_b8 = local_b8 + 1;
    sparse_iterator<float>::operator++((sparse_iterator<float> *)in_stack_fffffffffffffeb0);
  }
  this = local_18;
  sVar8 = std::
          priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
          ::size((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
                  *)0x266c79);
  std::vector<feature,_std::allocator<feature>_>::resize
            ((vector<feature,_std::allocator<feature>_> *)
             CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),sVar8);
  sVar8 = std::
          priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
          ::size((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
                  *)0x266c9e);
  local_d4 = (int)sVar8;
  while (local_d4 = local_d4 + -1, -1 < local_d4) {
    pvVar7 = std::
             priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
             ::top((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
                    *)0x266ccb);
    pvVar9 = std::vector<feature,_std::allocator<feature>_>::operator[](&local_18->c,(long)local_d4)
    ;
    uVar2 = *(undefined4 *)&pvVar7->field_0x4;
    uVar1 = pvVar7->weight_index;
    pvVar9->x = pvVar7->x;
    *(undefined4 *)&pvVar9->field_0x4 = uVar2;
    pvVar9->weight_index = uVar1;
    std::
    priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
    ::pop(this);
  }
  std::
  priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/kumpera[P]vowpal_wabbit/vowpalwabbit/lda_core.cc:1061:14)>
  ::~priority_queue((priority_queue<feature,_std::vector<feature,_std::allocator<feature>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_kumpera[P]vowpal_wabbit_vowpalwabbit_lda_core_cc:1061:14)>
                     *)0x266d23);
  return;
}

Assistant:

void get_top_weights(vw *all, int top_words_count, int topic, std::vector<feature> &output, T &weights)
{
  uint64_t length = (uint64_t)1 << all->num_bits;

  // get top features for this topic
  auto cmp = [](feature left, feature right) { return left.x > right.x; };
  std::priority_queue<feature, std::vector<feature>, decltype(cmp)> top_features(cmp);
  typename T::iterator iter = weights.begin();

  for (uint64_t i = 0; i < min(top_words_count, length); i++, ++iter)
    top_features.push({(&(*iter))[topic], iter.index()});

  for (uint64_t i = top_words_count; i < length; i++, ++iter)
  {
    weight v = (&(*iter))[topic];
    if (v > top_features.top().x)
    {
      top_features.pop();
      top_features.push({v, i});
    }
  }

  // extract idx and sort descending
  output.resize(top_features.size());
  for (int i = (int)top_features.size() - 1; i >= 0; i--)
  {
    output[i] = top_features.top();
    top_features.pop();
  }
}